

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O1

uint32_t icu_63::util64_tou(int64_t w,UChar *buf,uint32_t len,uint32_t radix,UBool raw)

{
  UChar UVar1;
  long lVar2;
  UChar *pUVar3;
  UChar *pUVar4;
  UChar *pUVar5;
  uint uVar6;
  ulong uVar7;
  UChar *pUVar8;
  ulong uVar9;
  bool bVar10;
  
  uVar6 = 2;
  if (2 < radix) {
    uVar6 = radix;
  }
  uVar9 = 0x24;
  if (uVar6 < 0x24) {
    uVar9 = (ulong)uVar6;
  }
  if ((((raw == '\0') && (len != 0)) && (w < 0)) && (radix == 10)) {
    w = -w;
    lVar2 = 0x2d;
  }
  else {
    pUVar8 = buf;
    if (w != 0 || len == 0) goto LAB_00256544;
    w = 0;
    lVar2 = 0x30;
    if (raw != '\0') {
      lVar2 = w;
    }
  }
  *buf = (UChar)lVar2;
  len = len - 1;
  pUVar8 = buf + 1;
LAB_00256544:
  bVar10 = len != 0;
  if (w != 0 && bVar10) {
    do {
      len = len - 1;
      lVar2 = w / (long)uVar9;
      uVar7 = w % (long)uVar9;
      if (raw == '\0') {
        uVar7 = (ulong)(byte)asciiDigits[(int)uVar7];
      }
      *pUVar8 = (UChar)uVar7;
      pUVar8 = pUVar8 + 1;
      bVar10 = len != 0;
    } while ((bVar10) && (w = lVar2, lVar2 != 0));
  }
  if (bVar10) {
    *pUVar8 = L'\0';
  }
  uVar9 = (ulong)((uint)(*buf == L'-') * 2);
  pUVar3 = pUVar8 + -1;
  if ((UChar *)((long)buf + uVar9) < pUVar3) {
    pUVar5 = (UChar *)(uVar9 + (long)buf);
    do {
      pUVar4 = pUVar5 + 1;
      UVar1 = *pUVar3;
      *pUVar3 = *pUVar5;
      *pUVar5 = UVar1;
      pUVar3 = pUVar3 + -1;
      pUVar5 = pUVar4;
    } while (pUVar4 < pUVar3);
  }
  return (uint32_t)((ulong)((long)pUVar8 - (long)buf) >> 1);
}

Assistant:

uint32_t util64_tou(int64_t w, UChar* buf, uint32_t len, uint32_t radix, UBool raw)
{    
    if (radix > 36) {
        radix = 36;
    } else if (radix < 2) {
        radix = 2;
    }
    int64_t base = radix;

    UChar* p = buf;
    if (len && (w < 0) && (radix == 10) && !raw) {
        w = -w;
        *p++ = kUMinus;
        --len;
    } else if (len && (w == 0)) {
        *p++ = (UChar)raw ? 0 : asciiDigits[0];
        --len;
    }

    while (len && (w != 0)) {
        int64_t n = w / base;
        int64_t m = n * base;
        int32_t d = (int32_t)(w-m);
        *p++ = (UChar)(raw ? d : asciiDigits[d]);
        w = n;
        --len;
    }
    if (len) {
        *p = 0; // null terminate if room for caller convenience
    }

    len = (uint32_t)(p - buf);
    if (*buf == kUMinus) {
        ++buf;
    }
    while (--p > buf) {
        UChar c = *p;
        *p = *buf;
        *buf = c;
        ++buf;
    }

    return len;
}